

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_group_ops(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  size_t sVar3;
  Allocator *pAVar4;
  int *piVar5;
  long *plVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  int i;
  uint uVar11;
  pointer ppLVar12;
  Layer *pLVar13;
  pointer ppLVar14;
  ulong uVar15;
  int iVar16;
  void *in_R8;
  size_t sVar17;
  void *pvVar18;
  long lVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ParamDict pd;
  Mat local_288;
  undefined1 local_240 [12];
  int local_234;
  int local_230;
  int local_22c;
  Mat local_228;
  void *local_1e0;
  int *piStack_1d8;
  size_t local_1d0;
  int local_1c8;
  Allocator *local_1c0;
  uint local_1b8;
  int iStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  size_t local_1a0;
  void *local_198;
  int *piStack_190;
  size_t local_188;
  int local_180;
  Allocator *local_178;
  uint local_170;
  int iStack_16c;
  uint uStack_168;
  int iStack_164;
  int local_160;
  size_t local_158;
  void *local_150;
  int *piStack_148;
  size_t sStack_140;
  int iStack_138;
  Allocator *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined8 local_110;
  void *local_108;
  int *piStack_100;
  size_t sStack_f8;
  int iStack_f0;
  Allocator *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c0;
  size_t local_b8;
  Allocator *local_b0;
  Mat local_a8;
  size_t local_60;
  Mat *local_58;
  size_t local_50;
  Option *local_48;
  ParamDict local_40;
  
  iVar21 = (this->super_ConvolutionDepthWise).num_output;
  iVar16 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar22 = (this->super_ConvolutionDepthWise).group;
  uVar15 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar22;
  uVar15 = (long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) / (long)iVar16;
  ppLVar14 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppLVar12 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48 = opt;
  if (0 < (int)((ulong)((long)ppLVar14 - (long)ppLVar12) >> 3)) {
    lVar19 = 0;
    do {
      if (ppLVar12[lVar19] != (Layer *)0x0) {
        (*ppLVar12[lVar19]->_vptr_Layer[1])();
        ppLVar12 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar14 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (int)((ulong)((long)ppLVar14 - (long)ppLVar12) >> 3));
  }
  local_c0 = &this->group_ops;
  if (ppLVar14 != ppLVar12) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar12;
  }
  iVar2 = (this->super_ConvolutionDepthWise).group;
  i = (this->super_ConvolutionDepthWise).num_output / iVar2;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c0,(long)iVar2);
  if (0 < (this->super_ConvolutionDepthWise).group) {
    local_22c = iVar16 * i *
                (((int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                       (long)(iVar21 / iVar22)) * iVar22) / iVar2);
    local_50 = (size_t)local_22c;
    local_60 = (size_t)i;
    local_58 = &(this->super_ConvolutionDepthWise).activation_params;
    sVar17 = 0;
    do {
      local_228.elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      local_228.data =
           (void *)(sVar17 * local_50 * local_228.elemsize +
                   (long)(this->super_ConvolutionDepthWise).weight_data.data);
      local_228.elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      local_228.allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      local_228.refcount = (int *)0x0;
      local_228.w = (int)local_50;
      local_228.dims = 1;
      local_228.h = 1;
      local_228.d = 1;
      local_228.c = 1;
      local_228.cstep = local_50;
      Mat::clone(&local_a8,(__fn *)&local_228,(void *)0x0,1,in_R8);
      if (local_228.refcount != (int *)0x0) {
        LOCK();
        *local_228.refcount = *local_228.refcount + -1;
        UNLOCK();
        if (*local_228.refcount == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            if (local_228.data != (void *)0x0) {
              free(local_228.data);
            }
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar20 = (this->super_ConvolutionDepthWise).bias_term == 0;
      if (bVar20) {
        pvVar18 = (void *)0x0;
        local_240._0_8_ = 0;
        local_230 = 0;
        local_b0 = (Allocator *)0x0;
        local_234 = 0;
        local_b8 = 0;
      }
      else {
        local_240._0_8_ = (this->super_ConvolutionDepthWise).bias_data.elemsize;
        pvVar18 = (void *)(sVar17 * local_60 * local_240._0_8_ +
                          (long)(this->super_ConvolutionDepthWise).bias_data.data);
        local_230 = (this->super_ConvolutionDepthWise).bias_data.elempack;
        local_b0 = (this->super_ConvolutionDepthWise).bias_data.allocator;
        local_b8 = local_60;
        local_234 = i;
      }
      uVar11 = (uint)!bVar20;
      pLVar13 = create_layer_cpu(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,(this->super_ConvolutionDepthWise).kernel_w);
      ParamDict::set(&local_40,0xb,(this->super_ConvolutionDepthWise).kernel_h);
      ParamDict::set(&local_40,2,(this->super_ConvolutionDepthWise).dilation_w);
      ParamDict::set(&local_40,0xc,(this->super_ConvolutionDepthWise).dilation_h);
      ParamDict::set(&local_40,3,(this->super_ConvolutionDepthWise).stride_w);
      ParamDict::set(&local_40,0xd,(this->super_ConvolutionDepthWise).stride_h);
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,(this->super_ConvolutionDepthWise).bias_term);
      ParamDict::set(&local_40,6,local_22c);
      ParamDict::set(&local_40,8,(this->super_ConvolutionDepthWise).int8_scale_term);
      ParamDict::set(&local_40,9,(this->super_ConvolutionDepthWise).activation_type);
      ParamDict::set(&local_40,10,local_58);
      (*pLVar13->_vptr_Layer[2])(pLVar13,&local_40);
      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
        lVar19 = 0x40;
        do {
          *(undefined8 *)((long)&local_228.data + lVar19) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x28) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x20) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x1c) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x14) = 0;
          *(undefined8 *)(local_240 + lVar19 + -8) = 0;
          *(undefined8 *)(local_240 + lVar19) = 0;
          *(undefined8 *)(local_240 + lVar19 + 4) = 0;
          *(undefined8 *)((long)&local_234 + lVar19) = 0;
          lVar19 = lVar19 + 0x48;
        } while (lVar19 != 0x160);
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        if (local_228.refcount != (int *)0x0) {
          LOCK();
          *local_228.refcount = *local_228.refcount + -1;
          UNLOCK();
          if (*local_228.refcount == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.data = local_a8.data;
        local_228.refcount = local_a8.refcount;
        local_228.elemsize = local_a8.elemsize;
        local_228.elempack = local_a8.elempack;
        local_228.allocator = local_a8.allocator;
        local_228.c = local_a8.c;
        local_228.cstep = local_a8.cstep;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize._0_4_ = 0;
          local_288.elemsize._4_4_ = 0;
          local_288.elempack = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_288.allocator = (Allocator *)0x0;
          local_288.dims = 0;
          local_288.w = 0;
          Mat::create(&local_288,i,4,(Allocator *)0x0);
          auVar9 = _DAT_005a31f0;
          auVar8 = _DAT_005a31e0;
          auVar7 = _DAT_005a30e0;
          uVar11 = local_288.c * (int)local_288.cstep;
          if (0 < (int)uVar11) {
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     sVar17 * 4);
            lVar19 = (ulong)uVar11 - 1;
            auVar26._8_4_ = (int)lVar19;
            auVar26._0_8_ = lVar19;
            auVar26._12_4_ = (int)((ulong)lVar19 >> 0x20);
            auVar26 = auVar26 ^ _DAT_005a30e0;
            uVar15 = 0;
            do {
              auVar24._8_4_ = (int)uVar15;
              auVar24._0_8_ = uVar15;
              auVar24._12_4_ = (int)(uVar15 >> 0x20);
              auVar25 = (auVar24 | auVar9) ^ auVar7;
              iVar21 = auVar26._0_4_;
              bVar20 = iVar21 < auVar25._0_4_;
              iVar22 = auVar26._4_4_;
              iVar16 = auVar25._4_4_;
              if ((bool)(~(iVar22 < iVar16 || iVar16 == iVar22 && bVar20) & 1)) {
                *(undefined4 *)((long)local_288.data + uVar15 * 4) = uVar1;
              }
              if (iVar22 >= iVar16 && (iVar16 != iVar22 || !bVar20)) {
                *(undefined4 *)((long)local_288.data + uVar15 * 4 + 4) = uVar1;
              }
              auVar24 = (auVar24 | auVar8) ^ auVar7;
              iVar16 = auVar24._4_4_;
              if (iVar16 <= iVar22 && (iVar16 != iVar22 || auVar24._0_4_ <= iVar21)) {
                *(undefined4 *)((long)local_288.data + uVar15 * 4 + 8) = uVar1;
                *(undefined4 *)((long)local_288.data + uVar15 * 4 + 0xc) = uVar1;
              }
              uVar15 = uVar15 + 4;
            } while ((uVar11 + 3 & 0xfffffffc) != uVar15);
          }
          piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (piStack_1d8 != (int *)0x0) {
            LOCK();
            *piStack_1d8 = *piStack_1d8 + -1;
            UNLOCK();
            if (*piStack_1d8 == 0) {
              if (local_1c0 == (Allocator *)0x0) {
                if (local_1e0 != (void *)0x0) {
                  free(local_1e0);
                }
              }
              else {
                (*local_1c0->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1d8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_1e0 = local_288.data;
          local_1d0 = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
          local_1c8 = local_288.elempack;
          local_1c0 = local_288.allocator;
          local_1b8 = local_288.dims;
          iStack_1b4 = local_288.w;
          uStack_1b0 = local_288.h;
          uStack_1ac = local_288.d;
          local_1a8 = local_288.c;
          local_1a0 = local_288.cstep;
          sVar3 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar18 = (void *)(sVar3 * sVar17 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar21 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_240._0_8_ = sVar17;
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (void *)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          uVar10 = local_240._0_8_;
          piStack_190 = (int *)0x0;
          local_170 = 1;
          iStack_16c = 1;
          uStack_168 = 1;
          iStack_164 = 1;
          local_160 = 1;
          local_158 = 1;
          piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_198 = pvVar18;
          local_188 = sVar3;
          local_180 = iVar21;
          local_178 = pAVar4;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  free(local_288.data);
                }
              }
              else {
                (*(local_288.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          sVar17 = uVar10;
          if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
            sVar3 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
            pvVar18 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
            iVar21 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
            pAVar4 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
            if (piStack_148 != (int *)0x0) {
              LOCK();
              *piStack_148 = *piStack_148 + -1;
              UNLOCK();
              if (*piStack_148 == 0) {
                if (local_130 == (Allocator *)0x0) {
                  if (local_150 != (void *)0x0) {
                    free(local_150);
                  }
                }
                else {
                  (*local_130->_vptr_Allocator[3])();
                }
              }
            }
            piStack_148 = (int *)0x0;
            local_128 = 0x100000001;
            uStack_120 = 0x100000001;
            local_118 = 1;
            local_110 = 1;
            sVar17 = local_240._0_8_;
            local_150 = (void *)(sVar3 * uVar10 + (long)pvVar18);
            sStack_140 = sVar3;
            iStack_138 = iVar21;
            local_130 = pAVar4;
          }
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
        (*pLVar13->_vptr_Layer[3])(pLVar13,&local_288);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
        lVar19 = 0xd8;
        do {
          piVar5 = *(int **)((long)&local_228.refcount + lVar19);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar18 = *(void **)((long)&local_228.data + lVar19);
              plVar6 = *(long **)((long)&local_228.allocator + lVar19);
              if (plVar6 == (long *)0x0) {
                if (pvVar18 != (void *)0x0) {
                  free(pvVar18);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_228.cstep + lVar19) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar19 + 4) = 0;
          *(undefined8 *)((long)&local_228.elemsize + lVar19 + 4) = 0;
          *(undefined8 *)((long)&local_228.data + lVar19) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar19) = 0;
          *(undefined8 *)((long)&local_228.dims + lVar19) = 0;
          *(undefined8 *)((long)&local_228.h + lVar19) = 0;
          *(undefined4 *)((long)&local_228.c + lVar19) = 0;
          lVar19 = lVar19 + -0x48;
        } while (lVar19 != -0x48);
      }
      else {
        lVar19 = 0x40;
        do {
          *(undefined8 *)((long)&local_228.data + lVar19) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x28) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x20) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x1c) = 0;
          *(undefined8 *)(local_240 + lVar19 + -0x14) = 0;
          *(undefined8 *)(local_240 + lVar19 + -8) = 0;
          *(undefined8 *)(local_240 + lVar19) = 0;
          *(undefined8 *)(local_240 + lVar19 + 4) = 0;
          *(undefined8 *)((long)&local_234 + lVar19) = 0;
          lVar19 = lVar19 + 0x48;
        } while (lVar19 != 0x1a8);
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        if (local_228.refcount != (int *)0x0) {
          LOCK();
          *local_228.refcount = *local_228.refcount + -1;
          UNLOCK();
          if (*local_228.refcount == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.data = local_a8.data;
        local_228.refcount = local_a8.refcount;
        local_228.elemsize = local_a8.elemsize;
        local_228.elempack = local_a8.elempack;
        local_228.allocator = local_a8.allocator;
        local_228.c = local_a8.c;
        local_228.cstep = local_a8.cstep;
        if (piStack_1d8 != (int *)0x0) {
          LOCK();
          *piStack_1d8 = *piStack_1d8 + -1;
          UNLOCK();
          if (*piStack_1d8 == 0) {
            if (local_1c0 == (Allocator *)0x0) {
              if (local_1e0 != (void *)0x0) {
                free(local_1e0);
              }
            }
            else {
              (*local_1c0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1d8 = (int *)0x0;
        local_1d0 = local_240._0_8_;
        local_1c8 = local_230;
        local_1c0 = local_b0;
        iStack_1b4 = local_234;
        local_1a0 = local_b8;
        local_1e0 = pvVar18;
        local_1b8 = uVar11;
        uStack_1b0 = uVar11;
        uStack_1ac = uVar11;
        local_1a8 = uVar11;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize._0_4_ = 0;
          local_288.elemsize._4_4_ = 0;
          local_288.elempack = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_288.allocator = (Allocator *)0x0;
          local_288.dims = 0;
          local_288.w = 0;
          Mat::create(&local_288,i,4,(Allocator *)0x0);
          auVar9 = _DAT_005a31f0;
          auVar8 = _DAT_005a31e0;
          auVar7 = _DAT_005a30e0;
          uVar11 = local_288.c * (int)local_288.cstep;
          if (0 < (int)uVar11) {
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     sVar17 * 4);
            lVar19 = (ulong)uVar11 - 1;
            auVar25._8_4_ = (int)lVar19;
            auVar25._0_8_ = lVar19;
            auVar25._12_4_ = (int)((ulong)lVar19 >> 0x20);
            uVar15 = 0;
            do {
              auVar23._8_4_ = (int)uVar15;
              auVar23._0_8_ = uVar15;
              auVar23._12_4_ = (int)(uVar15 >> 0x20);
              auVar26 = (auVar23 | auVar9) ^ auVar7;
              iVar21 = SUB164(auVar25 ^ auVar7,0);
              bVar20 = iVar21 < auVar26._0_4_;
              iVar22 = SUB164(auVar25 ^ auVar7,4);
              iVar16 = auVar26._4_4_;
              if ((bool)(~(iVar22 < iVar16 || iVar16 == iVar22 && bVar20) & 1)) {
                *(undefined4 *)((long)local_288.data + uVar15 * 4) = uVar1;
              }
              if (iVar22 >= iVar16 && (iVar16 != iVar22 || !bVar20)) {
                *(undefined4 *)((long)local_288.data + uVar15 * 4 + 4) = uVar1;
              }
              auVar26 = (auVar23 | auVar8) ^ auVar7;
              iVar16 = auVar26._4_4_;
              if (iVar16 <= iVar22 && (iVar16 != iVar22 || auVar26._0_4_ <= iVar21)) {
                *(undefined4 *)((long)local_288.data + uVar15 * 4 + 8) = uVar1;
                *(undefined4 *)((long)local_288.data + uVar15 * 4 + 0xc) = uVar1;
              }
              uVar15 = uVar15 + 4;
            } while ((uVar11 + 3 & 0xfffffffc) != uVar15);
          }
          piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (void *)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          piStack_190 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_198 = local_288.data;
          local_188 = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
          local_180 = local_288.elempack;
          local_178 = local_288.allocator;
          local_170 = local_288.dims;
          iStack_16c = local_288.w;
          uStack_168 = local_288.h;
          iStack_164 = local_288.d;
          local_160 = local_288.c;
          local_158 = local_288.cstep;
          sVar3 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar18 = (void *)(sVar3 * sVar17 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar21 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_240._0_8_ = sVar17;
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (Allocator *)0x0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (*local_130->_vptr_Allocator[3])();
              }
            }
          }
          uVar10 = local_240._0_8_;
          piStack_148 = (int *)0x0;
          local_128 = 0x100000001;
          uStack_120 = 0x100000001;
          local_118 = 1;
          local_110 = 1;
          piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_150 = pvVar18;
          sStack_140 = sVar3;
          iStack_138 = iVar21;
          local_130 = pAVar4;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  free(local_288.data);
                }
              }
              else {
                (*(local_288.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          sVar17 = uVar10;
          if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
            sVar3 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
            pvVar18 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
            iVar21 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
            pAVar4 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
            if (piStack_100 != (int *)0x0) {
              LOCK();
              *piStack_100 = *piStack_100 + -1;
              UNLOCK();
              if (*piStack_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            piStack_100 = (int *)0x0;
            local_e0 = 0x100000001;
            uStack_d8 = 0x100000001;
            local_d0 = 1;
            local_c8 = 1;
            sVar17 = local_240._0_8_;
            local_108 = (void *)(sVar3 * uVar10 + (long)pvVar18);
            sStack_f8 = sVar3;
            iStack_f0 = iVar21;
            local_e8 = pAVar4;
          }
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
        (*pLVar13->_vptr_Layer[3])(pLVar13,&local_288);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
        lVar19 = 0x120;
        do {
          piVar5 = *(int **)((long)&local_228.refcount + lVar19);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar18 = *(void **)((long)&local_228.data + lVar19);
              plVar6 = *(long **)((long)&local_228.allocator + lVar19);
              if (plVar6 == (long *)0x0) {
                if (pvVar18 != (void *)0x0) {
                  free(pvVar18);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_228.cstep + lVar19) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar19 + 4) = 0;
          *(undefined8 *)((long)&local_228.elemsize + lVar19 + 4) = 0;
          *(undefined8 *)((long)&local_228.data + lVar19) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar19) = 0;
          *(undefined8 *)((long)&local_228.dims + lVar19) = 0;
          *(undefined8 *)((long)&local_228.h + lVar19) = 0;
          *(undefined4 *)((long)&local_228.c + lVar19) = 0;
          lVar19 = lVar19 + -0x48;
        } while (lVar19 != -0x48);
      }
      (*pLVar13->_vptr_Layer[4])(pLVar13,local_48);
      (local_c0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar17] = pLVar13;
      ParamDict::~ParamDict(&local_40);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            if (local_a8.data != (void *)0x0) {
              free(local_a8.data);
            }
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      sVar17 = sVar17 + 1;
    } while ((long)sVar17 < (long)(this->super_ConvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}